

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::DoubleAPFloat::makeLargest(DoubleAPFloat *this,bool Neg)

{
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  Storage local_38;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    local_48 = 0x40;
    local_50.pVal = (uint64_t *)0x7fefffffffffffff;
    IEEEFloat::IEEEFloat(&local_38.IEEE,(fltSemantics *)semIEEEdouble,(APInt *)&local_50);
    APFloat::Storage::operator=
              ((Storage *)
               &(((this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,&local_38);
    APFloat::Storage::~Storage((Storage *)&local_38.IEEE);
    if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
      operator_delete__(local_50.pVal);
    }
    local_48 = 0x40;
    local_50.pVal = (uint64_t *)0x7c8ffffffffffffe;
    IEEEFloat::IEEEFloat(&local_38.IEEE,(fltSemantics *)semIEEEdouble,(APInt *)&local_50);
    APFloat::Storage::operator=
              ((Storage *)
               &(this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,&local_38);
    APFloat::Storage::~Storage((Storage *)&local_38.IEEE);
    if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
      operator_delete__(local_50.pVal);
    }
    if (Neg) {
      APFloat::changeSign((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
      APFloat::changeSign((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    }
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1084,"void llvm::detail::DoubleAPFloat::makeLargest(bool)");
}

Assistant:

void DoubleAPFloat::makeLargest(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0] = APFloat(semIEEEdouble, APInt(64, 0x7fefffffffffffffull));
  Floats[1] = APFloat(semIEEEdouble, APInt(64, 0x7c8ffffffffffffeull));
  if (Neg)
    changeSign();
}